

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cone.cpp
# Opt level: O1

Tuple4d * __thiscall
geometry::primitive::Cone::local_normal
          (Tuple4d *__return_storage_ptr__,Cone *this,Tuple4d *point,Intersection *hit)

{
  double *pdVar1;
  double dVar2;
  double x;
  double z;
  
  pdVar1 = math::Tuple4d::operator()(point,0);
  dVar2 = *pdVar1;
  pdVar1 = math::Tuple4d::operator()(point,2);
  dVar2 = *pdVar1 * *pdVar1 + dVar2 * dVar2;
  if ((this->m_closed != true) || (ABS(this->m_minmax[1]) <= dVar2 + 1e-05)) {
LAB_00106d0e:
    if ((this->m_closed == true) && (dVar2 + 1e-05 < ABS(this->m_minmax[0]))) {
      pdVar1 = math::Tuple4d::operator()(point,1);
      if (*pdVar1 <= this->m_minmax[0] + 1e-05) {
        dVar2 = -1.0;
        goto LAB_00106e17;
      }
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    pdVar1 = math::Tuple4d::operator()(point,1);
    dVar2 = *(double *)
             (&DAT_0010f4e0 +
             (ulong)(-(uint)((double)(-(ulong)(0.0 < *pdVar1) & 0x3ff0000000000000) * dVar2 != 0.0)
                    & 1) * 8);
    pdVar1 = math::Tuple4d::operator()(point,0);
    x = *pdVar1;
    pdVar1 = math::Tuple4d::operator()(point,2);
    z = *pdVar1;
  }
  else {
    pdVar1 = math::Tuple4d::operator()(point,1);
    if (*pdVar1 < this->m_minmax[1] + -1e-05) goto LAB_00106d0e;
    dVar2 = 1.0;
LAB_00106e17:
    x = 0.0;
    z = 0.0;
  }
  math::vector(x,dVar2,z);
  return __return_storage_ptr__;
}

Assistant:

math::Tuple4d geometry::primitive::Cone::local_normal(const math::Tuple4d &point, const core::Intersection &hit) const
{
    double distance = pow(point(0), 2) + pow(point(2), 2);
    if (m_closed &&
	distance + constants::EPSILON < std::abs(m_minmax[1]) &&
	point(1) >= m_minmax[1] - constants::EPSILON)
	return math::vector(0, 1, 0);
    else if (m_closed &&
	     distance + constants::EPSILON < std::abs(m_minmax[0]) &&
	     point(1) <= m_minmax[0] + constants::EPSILON)
	return math::vector(0, -1, 0);

    double y = sqrt(distance) * (point(1) > 0) ? -1 : 1;
    return math::vector(point(0), y, point(2));
}